

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::eval_divide_by_single_limb
          (uintwide_t<256U,_unsigned_int,_void,_false> *this,limb_type short_denominator,
          unsigned_fast_type u_offset,uintwide_t<256U,_unsigned_int,_void,_false> *remainder)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  lVar4 = (long)(0x800000000 - (u_offset << 0x20)) >> 0x1e;
  uVar3 = 0;
  uVar2 = 0;
  while( true ) {
    if (lVar4 == 0) break;
    uVar3 = CONCAT44((int)uVar3 - (int)uVar2 * short_denominator,
                     *(undefined4 *)
                      ((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar4 + -4));
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar2 = SUB168(auVar1 / ZEXT416(short_denominator),0);
    *(int *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar4 + -4) =
         SUB164(auVar1 / ZEXT416(short_denominator),0);
    lVar4 = lVar4 + -4;
  }
  if (remainder != (uintwide_t<256U,_unsigned_int,_void,_false> *)0x0) {
    uintwide_t<256u,unsigned_int,void,false>::uintwide_t<unsigned_int>(unsigned_int,std::
    enable_if<(std::is_integral<unsigned_int>::value&&std::is_unsigned<unsigned_int>::value)&&(std::
    numeric_limits<unsigned_int>::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
              (&local_30,(int)uVar3 - (int)uVar2 * short_denominator,
               (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_<__std::numeric_limits<limb_type>::digits))>
                *)0x0);
    *(undefined8 *)((remainder->values).super_array<unsigned_int,_8UL>.elems + 4) = local_20;
    *(undefined8 *)((remainder->values).super_array<unsigned_int,_8UL>.elems + 6) = uStack_18;
    *(undefined8 *)(remainder->values).super_array<unsigned_int,_8UL>.elems = local_30;
    *(undefined8 *)((remainder->values).super_array<unsigned_int,_8UL>.elems + 2) = uStack_28;
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }